

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * cfd::core::ScriptUtil::CreatePegoutLogkingScript
                   (Script *__return_storage_ptr__,BlockHash *genesisblock_hash,
                   Script *parent_locking_script,Pubkey *btc_pubkey_bytes,ByteData *whitelist_proof)

{
  bool bVar1;
  size_t sVar2;
  ByteData local_78;
  undefined1 local_50 [8];
  ScriptBuilder builder;
  ByteData *whitelist_proof_local;
  Pubkey *btc_pubkey_bytes_local;
  Script *parent_locking_script_local;
  BlockHash *genesisblock_hash_local;
  Script *locking_script;
  
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)whitelist_proof;
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_50);
  ScriptBuilder::AppendOperator
            ((ScriptBuilder *)local_50,(ScriptOperator *)ScriptOperator::OP_RETURN);
  BlockHash::GetData(&local_78,genesisblock_hash);
  ScriptBuilder::AppendData((ScriptBuilder *)local_50,&local_78);
  ByteData::~ByteData(&local_78);
  ScriptBuilder::AppendData((ScriptBuilder *)local_50,parent_locking_script);
  bVar1 = Pubkey::IsValid(btc_pubkey_bytes);
  if ((bVar1) &&
     (sVar2 = ByteData::GetDataSize
                        ((ByteData *)
                         builder.script_byte_array_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), sVar2 != 0)) {
    ScriptBuilder::AppendData((ScriptBuilder *)local_50,btc_pubkey_bytes);
    ScriptBuilder::AppendData
              ((ScriptBuilder *)local_50,
               (ByteData *)
               builder.script_byte_array_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  ScriptBuilder::Build(__return_storage_ptr__,(ScriptBuilder *)local_50);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreatePegoutLogkingScript(
    const BlockHash& genesisblock_hash, const Script& parent_locking_script,
    const Pubkey& btc_pubkey_bytes, const ByteData& whitelist_proof) {
  // create script
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(genesisblock_hash.GetData());
  builder.AppendData(parent_locking_script);
  if (btc_pubkey_bytes.IsValid() && (whitelist_proof.GetDataSize() > 0)) {
    builder.AppendData(btc_pubkey_bytes);
    builder.AppendData(whitelist_proof);
  }
  Script locking_script = builder.Build();
  return locking_script;
}